

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall CTPNIfnilBase::fold_constants(CTPNIfnilBase *this,CTcPrsSymtab *symtab)

{
  int iVar1;
  tc_constval_type_t tVar2;
  _func_int **pp_Var3;
  CTcConstVal *this_00;
  undefined8 in_RSI;
  CTcPrsNode *in_RDI;
  CTcPrsNode *local_28;
  CTcPrsNode *local_8;
  
  pp_Var3 = in_RDI[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
  pp_Var3 = (_func_int **)(**(code **)(*pp_Var3 + 0x78))(pp_Var3,in_RSI);
  in_RDI[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var3;
  pp_Var3 = in_RDI[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
  pp_Var3 = (_func_int **)(**(code **)(*pp_Var3 + 0x78))(pp_Var3,in_RSI);
  in_RDI[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var3;
  iVar1 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x25ab77);
  local_8 = in_RDI;
  if (iVar1 != 0) {
    this_00 = (CTcConstVal *)
              (**(code **)(*in_RDI[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase + 8))();
    tVar2 = CTcConstVal::get_type(this_00);
    if (tVar2 == TC_CVT_NIL) {
      local_28 = (CTcPrsNode *)in_RDI[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
    }
    else {
      local_28 = (CTcPrsNode *)in_RDI[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
    }
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

CTcPrsNode *CTPNIfnilBase::fold_constants(CTcPrsSymtab *symtab)
{
    /* fold constants in the subnodes */
    first_ = first_->fold_constants(symtab);
    second_ = second_->fold_constants(symtab);

    /* 
     *   if the first is now a constant, we can fold this entire expression
     *   node by choosing the first or second node.  Otherwise return myself
     *   unchanged.  
     */
    if (first_->is_const())
    {
        /* 
         *   if the first expression is nil, return the second, otherwise
         *   return the first 
         */
        return (first_->get_const_val()->get_type() == TC_CVT_NIL
                ? second_ : first_);
    }
    else
    {
        /* we can't fold this node any further - return it unchanged */
        return this;
    }
}